

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _Elt_pointer pbVar1;
  _Elt_pointer pbVar2;
  ptr p;
  anon_class_48_2_3c81cf3a_for_handler_ handler;
  ptr local_58;
  anon_class_48_2_3c81cf3a_for_handler_ local_40;
  
  local_58.h = (anon_class_48_2_3c81cf3a_for_handler_ *)(base + 1);
  local_58.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_58.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:70:32),_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::$_0::__0
            ((__0 *)&local_40,local_58.h);
  local_58.h = &local_40;
  ptr::reset(&local_58);
  if (owner != (void *)0x0) {
    pbVar1 = ((local_40.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->command_output_queue_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar2 = ((local_40.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->command_output_queue_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    fineftp::std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(local_40.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->command_output_queue_,&local_40.raw_message);
    if (pbVar2 == pbVar1) {
      fineftp::FtpSession::startSendingMessages
                (local_40.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_40);
  ptr::~ptr(&local_58);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }